

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  App *pAStack_210;
  int retCode;
  code *local_208;
  undefined8 local_200;
  thread local_1f8;
  thread logicThread;
  undefined1 local_1e0 [8];
  App app;
  MySimulator sim;
  Timer timy;
  Timer timx;
  char **argv_local;
  int argc_local;
  
  brown::Timer::Timer((Timer *)&timy.period,timxCallback);
  brown::Timer::Timer((Timer *)&sim.dirx,timyCallback);
  brown::MySimulator::MySimulator
            ((MySimulator *)&app.keystatus,(Timer *)&timy.period,(Timer *)&sim.dirx);
  brown::App::App((App *)local_1e0,(Simulator *)&app.keystatus,userInit,userLoop);
  local_208 = brown::App::runLogic;
  local_200 = 0;
  pAStack_210 = (App *)local_1e0;
  std::thread::thread<int(brown::App::*)(),brown::App*,void>
            (&local_1f8,(type *)&local_208,&stack0xfffffffffffffdf0);
  iVar1 = brown::App::runGraphics((App *)local_1e0);
  std::thread::join();
  std::thread::~thread(&local_1f8);
  brown::App::~App((App *)local_1e0);
  brown::MySimulator::~MySimulator((MySimulator *)&app.keystatus);
  return iVar1;
}

Assistant:

int main(int argc, const char * argv[]) {
    brown::Timer timx(timxCallback);
    brown::Timer timy(timyCallback);
    brown::MySimulator sim(timx, timy);
    brown::App app(sim, userInit, userLoop);
    std::thread logicThread(&brown::App::runLogic, &app);
    int retCode = app.runGraphics();
    logicThread.join();
    return retCode;
}